

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::flip32(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  badface **fstack;
  int iVar1;
  tetrahedron *pppdVar2;
  tetrahedron ppdVar3;
  memorypool *pmVar4;
  double *pdVar5;
  uint3 uVar6;
  tetgenmesh *p0;
  tetrahedron p1;
  tetrahedron ppdVar7;
  shellface *pppdVar8;
  uint uVar9;
  int i;
  long lVar10;
  undefined7 uVar15;
  tetrahedron ppdVar11;
  long lVar12;
  ulong *puVar13;
  void *pvVar14;
  int *piVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  tetgenmesh *ptVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  tetrahedron *pppdVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  face flipshs [3];
  triface local_160;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  tetgenmesh *local_140;
  tetrahedron local_138;
  ulong local_130;
  int local_124;
  tetrahedron local_120;
  tetrahedron local_118;
  tetrahedron local_110;
  tetrahedron *local_108;
  uint local_100 [8];
  ulong uStack_e0;
  tetrahedron *local_d8;
  uint local_d0 [10];
  face local_a8;
  ulong local_98;
  uint local_90;
  double local_88;
  double local_80;
  double local_78;
  ulong local_70;
  ulong uStack_68;
  ulong auStack_60 [6];
  
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&uStack_e0 + lVar10) = 0;
    *(undefined4 *)((long)local_d0 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&local_110 + lVar10) = 0;
    *(undefined4 *)((long)local_100 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_160.tet = (tetrahedron *)0x0;
  local_160.ver = 0;
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&local_70 + lVar10) = 0;
    *(undefined4 *)((long)auStack_60 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  if (hullflag < 1) {
LAB_00117524:
    local_144 = 0;
LAB_0011752c:
    local_148 = 0;
    local_14c = 0;
  }
  else {
    pppdVar27 = fliptets->tet;
    iVar21 = fliptets->ver;
    ppdVar11 = (tetrahedron)this->dummypoint;
    if (pppdVar27[orgpivot[iVar21]] == ppdVar11) {
      lVar10 = 8;
      do {
        *(int *)((long)&fliptets->tet + lVar10) = esymtbl[*(int *)((long)&fliptets->tet + lVar10)];
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x38);
      local_160.tet = fliptets[1].tet;
      local_160.ver = fliptets[1].ver;
      fliptets[1].tet = fliptets[2].tet;
      fliptets[1].ver = fliptets[2].ver;
      fliptets[2].tet = local_160.tet;
      fliptets[2].ver = local_160.ver;
      uVar15 = (undefined7)((ulong)local_160.tet >> 8);
      local_144 = (undefined4)CONCAT71(uVar15,1);
      local_14c = 0;
      local_148 = (undefined4)CONCAT71(uVar15,1);
    }
    else {
      uVar6 = (uint3)((uint)iVar21 >> 8);
      if (pppdVar27[apexpivot[iVar21]] != ppdVar11) {
        pppdVar2 = fliptets[1].tet;
        iVar25 = fliptets[1].ver;
        if (pppdVar2[apexpivot[iVar25]] != ppdVar11) goto LAB_00117524;
        fliptets->tet = fliptets[2].tet;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = pppdVar2;
        fliptets[2].ver = iVar25;
        fliptets[1].tet = pppdVar27;
        fliptets[1].ver = iVar21;
        local_144 = (undefined4)CONCAT71((uint7)uVar6,1);
        local_160.tet = pppdVar27;
        local_160.ver = iVar21;
        goto LAB_0011752c;
      }
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = fliptets[1].ver;
      fliptets[1].tet = fliptets[2].tet;
      fliptets[1].ver = fliptets[2].ver;
      fliptets[2].tet = pppdVar27;
      fliptets[2].ver = iVar21;
      local_144 = (undefined4)CONCAT71((uint7)uVar6,1);
      local_148 = 0;
      local_14c = CONCAT31(uVar6,1);
      local_160.tet = pppdVar27;
      local_160.ver = iVar21;
    }
  }
  iVar21 = fliptets->ver;
  pppdVar27 = fliptets->tet;
  local_140 = (tetgenmesh *)pppdVar27[apexpivot[iVar21]];
  local_138 = fliptets[1].tet[apexpivot[fliptets[1].ver]];
  local_118 = fliptets[2].tet[apexpivot[fliptets[2].ver]];
  local_120 = pppdVar27[destpivot[iVar21]];
  ppdVar11 = pppdVar27[orgpivot[iVar21]];
  this->flip32count = this->flip32count + 1;
  lVar10 = 8;
  do {
    uVar18 = eorgoppotbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar17 = *(ulong *)(*(long *)((long)fliptets + lVar10 + -8) + (ulong)(uVar18 & 3) * 8);
    uVar20 = (uint)uVar17 & 0xf;
    *(uint *)((long)local_d0 + lVar10 + -8) = uVar20;
    *(ulong *)((long)&uStack_e0 + lVar10) = uVar17 & 0xfffffffffffffff0;
    *(int *)((long)local_d0 + lVar10 + -8) = fsymtbl[(int)uVar18][uVar20];
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 8;
  do {
    uVar18 = edestoppotbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar17 = *(ulong *)(*(long *)((long)fliptets + lVar10 + -8) + (ulong)(uVar18 & 3) * 8);
    uVar20 = (uint)uVar17 & 0xf;
    *(uint *)((long)local_100 + lVar10 + -8) = uVar20;
    *(ulong *)((long)&local_110 + lVar10) = uVar17 & 0xfffffffffffffff0;
    *(int *)((long)local_100 + lVar10 + -8) = fsymtbl[(int)uVar18][uVar20];
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_70 = 0;
  if (this->checksubfaceflag == 0) {
    local_130 = 0xffffffff;
  }
  else {
    local_130 = 0xffffffff;
    lVar10 = 0;
    uVar17 = 0;
    do {
      lVar12 = *(long *)(*(long *)((long)&fliptets->tet + lVar10) + 0x48);
      if (lVar12 == 0) {
        *(undefined8 *)((long)auStack_60 + lVar10 + -8) = 0;
      }
      else {
        uVar18 = *(uint *)((long)&fliptets->ver + lVar10);
        uVar24 = *(ulong *)(lVar12 + (ulong)(uVar18 & 3) * 8);
        uVar20 = (uint)uVar24 & 7;
        *(uint *)((long)auStack_60 + lVar10) = uVar20;
        *(ulong *)((long)auStack_60 + lVar10 + -8) = uVar24 & 0xfffffffffffffff8;
        *(int *)((long)auStack_60 + lVar10) = tspivottbl[(int)uVar18][uVar20];
      }
      lVar12 = *(long *)((long)auStack_60 + lVar10 + -8);
      if (lVar12 == 0) {
        local_130 = uVar17 & 0xffffffff;
      }
      else {
        local_70 = (ulong)((int)local_70 + 1);
        *(undefined8 *)(lVar12 + 0x48) = 0;
        *(undefined8 *)(lVar12 + 0x50) = 0;
      }
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar17 != 3);
    local_70 = CONCAT71((int7)(local_70 >> 8),0 < (int)local_70);
  }
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  pppdVar27 = fliptets->tet;
  *(undefined4 *)((long)pppdVar27 + (long)this->elemmarkerindex * 4) = 0;
  *(undefined4 *)((long)fliptets[1].tet + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar3 = pppdVar27[8];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
    }
    ppdVar3 = fliptets[1].tet[8];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  iVar21 = this->checksubfaceflag;
  if (iVar21 != 0) {
    ppdVar3 = fliptets->tet[9];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar3 = fliptets[1].tet[9];
    if (ppdVar3 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar3 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar3;
      pmVar4->items = pmVar4->items + -1;
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
  }
  if ((iVar21 != 0 & (byte)local_70) == 1) {
    uVar18 = this->numelemattrib;
    iVar21 = this->b->varvolume;
    iVar25 = this->elemattribindex;
    iVar1 = this->volumeboundindex;
    lVar10 = 0;
    do {
      if (0 < (int)uVar18) {
        pppdVar27 = fliptets[(int)local_130].tet;
        pppdVar2 = fliptets[lVar10].tet;
        uVar17 = 0;
        do {
          pppdVar2[(long)iVar25 + uVar17] = pppdVar27[(long)iVar25 + uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      if (iVar21 != 0) {
        fliptets[lVar10].tet[iVar1] = fliptets[(int)local_130].tet[iVar1];
      }
      bVar28 = lVar10 == 0;
      lVar10 = lVar10 + 1;
    } while (bVar28);
  }
  local_124 = hullflag;
  tetrahedrondealloc(this,fliptets[2].tet);
  ppdVar7 = local_118;
  p1 = local_120;
  ppdVar3 = local_138;
  ptVar22 = local_140;
  if (local_124 < 1) {
    iVar21 = fliptets->ver;
    fliptets->tet[orgpivot[iVar21]] = (tetrahedron)local_140;
    fliptets->tet[destpivot[iVar21]] = local_138;
    fliptets->tet[apexpivot[iVar21]] = local_118;
    fliptets->tet[oppopivot[iVar21]] = local_120;
    iVar21 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar21]] = local_138;
    fliptets[1].tet[destpivot[iVar21]] = (tetrahedron)local_140;
    fliptets[1].tet[apexpivot[iVar21]] = local_118;
    fliptets[1].tet[oppopivot[iVar21]] = ppdVar11;
  }
  else if (local_118 == (tetrahedron)this->dummypoint) {
    iVar21 = fliptets->ver;
    fliptets->tet[orgpivot[iVar21]] = local_138;
    fliptets->tet[destpivot[iVar21]] = (tetrahedron)local_140;
    fliptets->tet[apexpivot[iVar21]] = local_120;
    fliptets->tet[oppopivot[iVar21]] = local_118;
    iVar25 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar25]] = (tetrahedron)local_140;
    fliptets[1].tet[destpivot[iVar25]] = local_138;
    iVar1 = apexpivot[iVar25];
    fliptets[1].tet[iVar1] = ppdVar11;
    fliptets[1].tet[oppopivot[iVar25]] = local_118;
    fliptets->ver = esymtbl[iVar21];
    fliptets[1].ver = esymtbl[fliptets[1].ver];
    ptVar22 = (tetgenmesh *)(long)iVar1;
  }
  else {
    if (local_120 == (tetrahedron)this->dummypoint) {
      this->hullsize = this->hullsize + -2;
    }
    iVar21 = fliptets->ver;
    fliptets->tet[orgpivot[iVar21]] = (tetrahedron)local_140;
    fliptets->tet[destpivot[iVar21]] = local_138;
    fliptets->tet[apexpivot[iVar21]] = local_118;
    fliptets->tet[oppopivot[iVar21]] = local_120;
    iVar21 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar21]] = local_138;
    fliptets[1].tet[destpivot[iVar21]] = (tetrahedron)local_140;
    fliptets[1].tet[apexpivot[iVar21]] = local_118;
    fliptets[1].tet[oppopivot[iVar21]] = ppdVar11;
  }
  local_110 = ppdVar11;
  if (fc->remove_ndelaunay_edge != 0) {
    if (local_118 == (tetrahedron)this->dummypoint) {
      dVar29 = tetprismvol(ptVar22,(double *)ppdVar11,(double *)local_120,(double *)local_140,
                           (double *)local_138);
      dVar30 = 0.0;
LAB_00117c68:
      dVar32 = 0.0;
      dVar31 = 0.0;
      dVar33 = 0.0;
    }
    else {
      if (local_120 == (tetrahedron)this->dummypoint) {
        dVar30 = tetprismvol(ptVar22,(double *)local_138,(double *)local_140,(double *)local_118,
                             (double *)ppdVar11);
        dVar29 = 0.0;
        goto LAB_00117c68;
      }
      dVar29 = tetprismvol(ptVar22,(double *)ppdVar11,(double *)local_120,(double *)local_140,
                           (double *)local_138);
      local_78 = tetprismvol(ptVar22,(double *)ppdVar11,(double *)p1,(double *)ppdVar3,
                             (double *)ppdVar7);
      p0 = local_140;
      local_80 = tetprismvol(ptVar22,(double *)ppdVar11,(double *)p1,(double *)ppdVar7,
                             (double *)local_140);
      ppdVar7 = local_118;
      local_88 = tetprismvol(ptVar22,(double *)p0,(double *)ppdVar3,(double *)local_118,(double *)p1
                            );
      dVar30 = tetprismvol(ptVar22,(double *)ppdVar3,(double *)local_140,(double *)ppdVar7,
                           (double *)ppdVar11);
      dVar31 = local_78;
      dVar32 = local_80;
      dVar33 = local_88;
    }
    fc->tetprism_vol_sum = ((((dVar30 + dVar33) - dVar29) - dVar31) - dVar32) + fc->tetprism_vol_sum
    ;
  }
  uVar18 = fliptets->ver;
  uVar20 = fliptets[1].ver;
  fliptets->tet[uVar18 & 3] =
       (tetrahedron)((long)bondtbl[(int)uVar18][(int)uVar20] | (ulong)fliptets[1].tet);
  fliptets[1].tet[uVar20 & 3] =
       (tetrahedron)((long)bondtbl[(int)uVar20][(int)uVar18] | (ulong)fliptets->tet);
  iVar21 = fliptets->ver;
  lVar10 = 8;
  do {
    pppdVar27 = fliptets->tet;
    uVar18 = esymtbl[iVar21];
    uVar17 = *(ulong *)((long)&uStack_e0 + lVar10);
    uVar20 = *(uint *)((long)local_d0 + lVar10 + -8);
    pppdVar27[uVar18 & 3] = (tetrahedron)((long)bondtbl[(int)uVar18][(int)uVar20] | uVar17);
    *(ulong *)(uVar17 + (ulong)(uVar20 & 3) * 8) =
         (long)bondtbl[(int)uVar20][(int)uVar18] | (ulong)pppdVar27;
    iVar21 = enexttbl[iVar21];
    fliptets->ver = iVar21;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  iVar21 = fliptets[1].ver;
  lVar10 = 8;
  do {
    local_160.tet = fliptets[1].tet;
    local_160.ver = esymtbl[iVar21];
    uVar17 = *(ulong *)((long)&local_110 + lVar10);
    uVar18 = *(uint *)((long)local_100 + lVar10 + -8);
    local_160.tet[local_160.ver & 3] =
         (tetrahedron)((long)bondtbl[local_160.ver][(int)uVar18] | uVar17);
    *(ulong *)(uVar17 + (ulong)(uVar18 & 3) * 8) =
         (long)bondtbl[(int)uVar18][local_160.ver] | (ulong)local_160.tet;
    iVar21 = eprevtbl[iVar21];
    fliptets[1].ver = iVar21;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  pppdVar27 = local_160.tet;
  uVar18 = local_160.ver;
  if (this->checksubsegflag != 0) {
    lVar10 = 0;
    do {
      if ((*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[(int)local_d0[lVar10 * 4]] * 8), pdVar5 != (double *)0x0)) {
        if (fliptets->tet[8] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets->tet[8] = ppdVar11;
          lVar12 = 0;
          do {
            fliptets->tet[8][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
        }
        uVar17 = (ulong)pdVar5 & 0xfffffffffffffff8;
        iVar21 = fliptets->ver;
        fliptets->tet[8][ver2edge[iVar21]] = pdVar5;
        *(ulong *)(uVar17 + 0x48) = (long)iVar21 | (ulong)fliptets->tet;
        if (fliptets[1].tet[8] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets[1].tet[8] = ppdVar11;
          lVar12 = 0;
          do {
            fliptets[1].tet[8][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
        }
        iVar21 = fliptets[1].ver;
        fliptets[1].tet[8][ver2edge[iVar21]] = pdVar5;
        *(ulong *)(uVar17 + 0x48) = (long)iVar21 | (ulong)fliptets[1].tet;
        if ((fc->chkencflag & 1) != 0) {
          uVar18 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar18 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar18 | 4;
            puVar13 = (ulong *)memorypool::alloc(pmVar4);
            *puVar13 = uVar17;
            *(uint *)(puVar13 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      pppdVar27 = fliptets->tet;
      iVar21 = eprevtbl[esymtbl[fliptets->ver]];
      if ((*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[enexttbl[(int)local_d0[lVar10 * 4]]] * 8),
         pdVar5 != (double *)0x0)) {
        if (pppdVar27[8] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar27[8] = ppdVar11;
          lVar12 = 0;
          do {
            pppdVar27[8][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
        }
        uVar17 = (ulong)pdVar5 & 0xfffffffffffffff8;
        pppdVar27[8][ver2edge[iVar21]] = pdVar5;
        *(ulong *)(uVar17 + 0x48) = (long)iVar21 | (ulong)pppdVar27;
        if ((fc->chkencflag & 1) != 0) {
          uVar18 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar18 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar18 | 4;
            puVar13 = (ulong *)memorypool::alloc(pmVar4);
            *puVar13 = uVar17;
            *(uint *)(puVar13 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    local_160.tet = pppdVar27;
    local_160.ver = iVar21;
    do {
      pppdVar27 = fliptets[1].tet;
      uVar18 = enexttbl[esymtbl[fliptets[1].ver]];
      if ((*(long *)(*(long *)(local_100 + lVar10 * 4 + -2) + 0x40) != 0) &&
         (pdVar5 = *(double **)
                    (*(long *)(*(long *)(local_100 + lVar10 * 4 + -2) + 0x40) +
                    (long)ver2edge[eprevtbl[(int)local_100[lVar10 * 4]]] * 8),
         pdVar5 != (double *)0x0)) {
        if (pppdVar27[8] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar27[8] = ppdVar11;
          lVar12 = 0;
          do {
            pppdVar27[8][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
        }
        uVar17 = (ulong)pdVar5 & 0xfffffffffffffff8;
        pppdVar27[8][ver2edge[(int)uVar18]] = pdVar5;
        *(ulong *)(uVar17 + 0x48) = (long)(int)uVar18 | (ulong)pppdVar27;
        if ((fc->chkencflag & 1) != 0) {
          uVar20 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar20 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar20 | 4;
            puVar13 = (ulong *)memorypool::alloc(pmVar4);
            *puVar13 = uVar17;
            *(uint *)(puVar13 + 1) = (uint)pdVar5 & 7;
          }
        }
      }
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  local_160.ver = uVar18;
  local_160.tet = pppdVar27;
  if (this->checksubfaceflag == 0) goto LAB_00118933;
  lVar10 = 0;
  pppdVar27 = local_160.tet;
  uVar18 = local_160.ver;
  do {
    if (*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x48) != 0) {
      uVar17 = *(ulong *)(*(long *)(*(long *)(local_d0 + lVar10 * 4 + -2) + 0x48) +
                         (ulong)(local_d0[lVar10 * 4] & 3) * 8);
      if (uVar17 != 0) {
        iVar21 = tspivottbl[(int)local_d0[lVar10 * 4]][(uint)uVar17 & 7];
        pppdVar27 = fliptets->tet;
        uVar18 = esymtbl[fliptets->ver];
        if (pppdVar27[9] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar27[9] = ppdVar11;
          lVar12 = 0;
          do {
            pppdVar27[9][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
        }
        uVar17 = uVar17 & 0xfffffffffffffff8;
        uVar24 = (long)iVar21 ^ 1;
        pppdVar27[9][uVar18 & 3] = (double *)((long)tsbondtbl[(int)uVar18][uVar24] | uVar17);
        *(ulong *)(uVar17 + 0x48 + (ulong)((uint)uVar24 & 1) * 8) =
             (long)stbondtbl[(int)uVar18][uVar24] | (ulong)pppdVar27;
        if ((fc->chkencflag & 2) != 0) {
          uVar20 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar20 & 4) == 0) {
            pmVar4 = this->badsubfacs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar20 | 4;
            puVar13 = (ulong *)memorypool::alloc(pmVar4);
            *puVar13 = uVar17;
            *(uint *)(puVar13 + 1) = (uint)uVar24;
          }
        }
      }
    }
    fliptets->ver = enexttbl[fliptets->ver];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  local_160.tet = pppdVar27;
  local_160.ver = uVar18;
  do {
    if (*(long *)(*(long *)(local_100 + lVar10 * 4 + -2) + 0x48) != 0) {
      uVar17 = *(ulong *)(*(long *)(*(long *)(local_100 + lVar10 * 4 + -2) + 0x48) +
                         (ulong)(local_100[lVar10 * 4] & 3) * 8);
      if (uVar17 != 0) {
        iVar21 = tspivottbl[(int)local_100[lVar10 * 4]][(uint)uVar17 & 7];
        pppdVar27 = fliptets[1].tet;
        uVar18 = esymtbl[fliptets[1].ver];
        if (pppdVar27[9] == (tetrahedron)0x0) {
          ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar27[9] = ppdVar11;
          lVar12 = 0;
          do {
            pppdVar27[9][lVar12] = (double *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
        }
        uVar17 = uVar17 & 0xfffffffffffffff8;
        uVar24 = (long)iVar21 ^ 1;
        pppdVar27[9][uVar18 & 3] = (double *)((long)tsbondtbl[(int)uVar18][uVar24] | uVar17);
        *(ulong *)(uVar17 + 0x48 + (ulong)((uint)uVar24 & 1) * 8) =
             (long)stbondtbl[(int)uVar18][uVar24] | (ulong)pppdVar27;
        if ((fc->chkencflag & 2) != 0) {
          uVar20 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar20 & 4) == 0) {
            pmVar4 = this->badsubfacs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar20 | 4;
            puVar13 = (ulong *)memorypool::alloc(pmVar4);
            *puVar13 = uVar17;
            *(uint *)(puVar13 + 1) = (uint)uVar24;
          }
        }
      }
    }
    fliptets[1].ver = eprevtbl[fliptets[1].ver];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_160.tet = pppdVar27;
  local_160.ver = uVar18;
  if ((char)local_70 == '\0') goto LAB_00118933;
  lVar10 = 0;
  do {
    *(undefined8 *)((long)&local_a8.sh + lVar10) = 0;
    *(undefined4 *)((long)&local_a8.shver + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  iVar21 = (int)local_130;
  iVar25 = iVar21 + ((iVar21 + 1) / 3) * -3 + 1;
  local_a8.sh = (shellface *)auStack_60[(long)iVar25 * 2 + -1];
  local_a8.shver = (int)auStack_60[(long)iVar25 * 2];
  lVar10 = (long)(((iVar21 + 2) / 3) * -3 + iVar21 + 2);
  local_98 = auStack_60[lVar10 * 2 + -1];
  local_90 = (uint)auStack_60[lVar10 * 2] ^ 1;
  flip22(this,&local_a8,0,fc->chkencflag);
  pppdVar27 = fliptets->tet;
  iVar21 = fliptets->ver;
  pppdVar2 = fliptets[1].tet;
  local_100[0] = fliptets[1].ver;
  if (0 < iVar25) {
    do {
      iVar21 = enexttbl[iVar21];
      local_100[0] = eprevtbl[(int)local_100[0]];
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  uVar18 = esymtbl[iVar21];
  local_130 = (ulong)(uint)local_a8.shver;
  uVar17 = (ulong)local_a8.shver;
  uVar24 = uVar17 ^ 1;
  uVar20 = (uint)uVar24;
  ppdVar11 = pppdVar27[9];
  local_108 = pppdVar2;
  local_d8 = pppdVar27;
  local_d0[0] = uVar18;
  if (ppdVar11 == (tetrahedron)0x0) {
LAB_00118651:
    local_a8.shver = uVar20;
    ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
    uVar23 = (uint)local_130;
    pppdVar27[9] = ppdVar11;
    lVar10 = 0;
    do {
      pppdVar27[9][lVar10] = (double *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    if ((double *)0x7 < ppdVar11[uVar18 & 3]) goto LAB_00118b83;
    uVar23 = local_a8.shver;
    if (ppdVar11 == (tetrahedron)0x0) goto LAB_00118651;
  }
  pppdVar8 = local_a8.sh;
  uVar26 = (ulong)((uVar18 & 3) << 3);
  *(ulong *)((long)pppdVar27[9] + uVar26) =
       (long)tsbondtbl[(int)uVar18][uVar24] | (ulong)local_a8.sh;
  local_a8.sh[(ulong)(uVar20 & 1) + 9] =
       (shellface)((long)stbondtbl[(int)uVar18][uVar24] | (ulong)pppdVar27);
  uVar24 = *(ulong *)((long)pppdVar27 + uVar26);
  pppdVar27 = (tetrahedron *)(uVar24 & 0xfffffffffffffff0);
  uVar18 = fsymtbl[(int)uVar18][(uint)uVar24 & 0xf];
  local_d8 = pppdVar27;
  local_d0[0] = uVar18;
  local_a8.shver = uVar23;
  if (pppdVar27[9] == (tetrahedron)0x0) {
    ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
    uVar23 = (uint)local_130;
    pppdVar27[9] = ppdVar11;
    lVar10 = 0;
    do {
      pppdVar27[9][lVar10] = (double *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  uVar9 = local_90;
  pppdVar27[9][uVar18 & 3] = (double *)((long)tsbondtbl[(int)uVar18][uVar17] | (ulong)pppdVar8);
  pppdVar8[(ulong)(uVar23 & 1) + 9] =
       (shellface)((long)stbondtbl[(int)uVar18][uVar17] | (ulong)pppdVar27);
  uVar18 = esymtbl[(int)local_100[0]];
  uVar17 = (ulong)(int)local_90;
  uVar24 = uVar17 ^ 1;
  uVar23 = (uint)uVar24;
  ppdVar11 = pppdVar2[9];
  local_100[0] = uVar18;
  local_90 = uVar23;
  if (ppdVar11 == (tetrahedron)0x0) {
LAB_001187f2:
    ppdVar11 = (tetrahedron)memorypool::alloc(this->tet2subpool);
    pppdVar2[9] = ppdVar11;
    lVar10 = 0;
    do {
      pppdVar2[9][lVar10] = (double *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    uVar20 = local_a8.shver;
    if ((double *)0x7 < ppdVar11[uVar18 & 3]) {
LAB_00118b83:
      local_a8.shver = uVar20;
      puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
      puts("  the message above, your input data set, and the exact");
      puts("  command line you used to run this program, thank you.");
      exit(2);
    }
    if (ppdVar11 == (tetrahedron)0x0) goto LAB_001187f2;
  }
  uVar26 = local_98;
  uVar19 = (ulong)((uVar18 & 3) << 3);
  *(ulong *)((long)pppdVar2[9] + uVar19) = (long)tsbondtbl[(int)uVar18][uVar24] | local_98;
  *(ulong *)(local_98 + 0x48 + (ulong)(uVar23 & 1) * 8) =
       (long)stbondtbl[(int)uVar18][uVar24] | (ulong)pppdVar2;
  uVar24 = *(ulong *)((long)pppdVar2 + uVar19);
  uVar19 = uVar24 & 0xfffffffffffffff0;
  uVar18 = fsymtbl[(int)uVar18][(uint)uVar24 & 0xf];
  local_108 = (tetrahedron *)uVar19;
  local_100[0] = uVar18;
  local_90 = uVar9;
  if (*(long *)(uVar19 + 0x48) == 0) {
    pvVar14 = memorypool::alloc(this->tet2subpool);
    *(void **)(uVar19 + 0x48) = pvVar14;
    lVar10 = 0;
    do {
      *(undefined8 *)(*(long *)(uVar19 + 0x48) + lVar10 * 8) = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  *(ulong *)(*(long *)(uVar19 + 0x48) + (ulong)(uVar18 & 3) * 8) =
       (long)tsbondtbl[(int)uVar18][uVar17] | uVar26;
  *(ulong *)(uVar26 + 0x48 + (ulong)(uVar9 & 1) * 8) = (long)stbondtbl[(int)uVar18][uVar17] | uVar19
  ;
LAB_00118933:
  if ((fc->chkencflag & 4) != 0) {
    lVar10 = 0;
    do {
      enqueuetetrahedron(this,(triface *)((long)&fliptets->tet + lVar10));
      lVar10 = lVar10 + 0x10;
    } while (lVar10 == 0x10);
  }
  iVar21 = this->point2simindex;
  (&local_140->in)[iVar21] = (tetgenio *)fliptets->tet;
  local_138[iVar21] = (double *)fliptets->tet;
  local_118[iVar21] = (double *)fliptets->tet;
  local_120[iVar21] = (double *)fliptets->tet;
  local_110[iVar21] = (double *)fliptets[1].tet;
  if ((char)local_144 == '\x01' && 0 < local_124) {
    if ((char)local_148 == '\0') {
      if ((char)local_14c == '\0') {
        fliptets->ver = enexttbl[fliptets->ver];
        iVar21 = fliptets[1].ver;
        piVar16 = eprevtbl;
      }
      else {
        fliptets->ver = eprevtbl[fliptets->ver];
        iVar21 = fliptets[1].ver;
        piVar16 = enexttbl;
      }
      iVar21 = piVar16[iVar21];
    }
    else {
      pppdVar27 = fliptets->tet;
      iVar21 = fliptets->ver;
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = fliptets[1].ver;
      fliptets[1].tet = pppdVar27;
    }
    fliptets[1].ver = iVar21;
  }
  if (0 < fc->enqflag) {
    local_160.tet = fliptets->tet;
    local_160.ver = enextesymtbl[fliptets->ver];
    fstack = &this->flipstack;
    flippush(this,fstack,&local_160);
    local_160.tet = fliptets[1].tet;
    local_160.ver = eprevesymtbl[fliptets[1].ver];
    flippush(this,fstack,&local_160);
    if (1 < fc->enqflag) {
      local_160.tet = fliptets->tet;
      local_160.ver = eprevesymtbl[fliptets->ver];
      flippush(this,fstack,&local_160);
      local_160.tet = fliptets[1].tet;
      local_160.ver = enextesymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_160);
      local_160.tet = fliptets->tet;
      local_160.ver = esymtbl[fliptets->ver];
      flippush(this,fstack,&local_160);
      local_160.tet = fliptets[1].tet;
      local_160.ver = esymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_160);
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip32(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  face flipshs[3]; 
  face checkseg; 
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // Rangle = {-1, 0, 1, 2}
  int spivot = -1, scount = 0; // for flip22()
  int t1ver; 
  int i, j;

  if (hullflag > 0) {
    // Check if e is 'dummypoint'.
    if (org(fliptets[0]) == dummypoint) {
      // Reverse the edge.
      for (i = 0; i < 3; i++) {
        esymself(fliptets[i]);
      }
      // Swap the last two tets.
      newface = fliptets[1];
      fliptets[1] = fliptets[2];
      fliptets[2] = newface;
      dummyflag = -1; // e is dummypoint.
    } else {
      // Check if a or b is the 'dummypoint'.
      if (apex(fliptets[0]) == dummypoint) { 
        dummyflag = 1;  // a is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else if (apex(fliptets[1]) == dummypoint) {
        dummyflag = 2;  // b is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[2];
        fliptets[2] = fliptets[1];
        fliptets[1] = newface;
      } else {
        dummyflag = 0;  // either c or d may be dummypoint.
      }
    }
  }

  pa = apex(fliptets[0]);
  pb = apex(fliptets[1]);
  pc = apex(fliptets[2]);
  pd = dest(fliptets[0]);
  pe = org(fliptets[0]);

  flip32count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], casface);
    fsym(casface, topcastets[i]);
  }
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], casface);
    fsym(casface, botcastets[i]);
  }

  if (checksubfaceflag) {
    // Check if there are interior subfaces at the edge [e,d].
    for (i = 0; i < 3; i++) {
      tspivot(fliptets[i], flipshs[i]);
      if (flipshs[i].sh != NULL) {
        // Found an interior subface.
        stdissolve(flipshs[i]); // Disconnect the sub-tet bond.
        scount++;
      } else {
        spivot = i;
      }
    }
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  if (checksubfaceflag) {
    if (scount > 0) {
      // The element attributes and volume constraint must be set correctly.
      // There are two subfaces involved in this flip. The three tets are
      //   separated into two different regions, one may be exterior. The
      //   first region has two tets, and the second region has only one.
      //   The two created tets must be in the same region as the first region. 
      //   The element attributes and volume constraint must be set correctly.
      //assert(spivot != -1);
      // The tet fliptets[spivot] is in the first region.
      for (j = 0; j < 2; j++) {
        for (i = 0; i < numelemattrib; i++) {
          attrib = elemattribute(fliptets[spivot].tet, i);
          setelemattribute(fliptets[j].tet, i, attrib);
        }
        if (b->varvolume) {
          volume = volumebound(fliptets[spivot].tet);
          setvolumebound(fliptets[j].tet, volume);
        }
      }
    }
  }
  // Delete an old tet.
  tetrahedrondealloc(fliptets[2].tet);

  if (hullflag > 0) {
    // Check if c is dummypointc.
    if (pc != dummypoint) {
      // Check if d is dummypoint.
      if (pd != dummypoint) {
        // No hull tet is involved.
      } else {
        // We deleted three hull tets, and created one hull tet.
        hullsize -= 2;
      }
      setvertices(fliptets[0], pa, pb, pc, pd);
      setvertices(fliptets[1], pb, pa, pc, pe);
    } else {
      // c is dummypoint. The two new tets are hull tets.
      setvertices(fliptets[0], pb, pa, pd, pc);
      setvertices(fliptets[1], pa, pb, pe, pc);
      // Adjust badc -> abcd.
      esymself(fliptets[0]);
      // Adjust abec -> bace.
      esymself(fliptets[1]);
      // The hullsize does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
    setvertices(fliptets[1], pb, pa, pc, pe);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[3], volpos[2], vol_diff;
    if (pc != dummypoint) {
      if (pd != dummypoint) {
        volneg[0] = tetprismvol(pe, pd, pa, pb);
        volneg[1] = tetprismvol(pe, pd, pb, pc);
        volneg[2] = tetprismvol(pe, pd, pc, pa);
        volpos[0] = tetprismvol(pa, pb, pc, pd);
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volpos[0] = 0.;
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      }
    } else { // pc == dummypoint.
      volneg[0] = tetprismvol(pe, pd, pa, pb);
      volneg[1] = 0.;
      volneg[2] = 0.;
      volpos[0] = 0.;
      volpos[1] = 0.;
    }
    vol_diff = volpos[0] + volpos[1] - volneg[0] - volneg[1] - volneg[2];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond abcd <==> bace.
  bond(fliptets[0], fliptets[1]);
  // Bond new faces to top outer boundary faces (at abcd).
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface);
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  // Bond new faces to bottom outer boundary faces (at bace).
  for (i = 0; i < 3; i++) {
    esym(fliptets[1], newface);
    bond(newface, botcastets[i]);
    eprevself(fliptets[1]);
  }

  if (checksubsegflag) {
    // Bond 9 segments to new (flipped) tets.
    for (i = 0; i < 3; i++) { // edges a->b, b->c, c->a.      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        tssbond1(fliptets[1], checkseg);
        sstbond1(checkseg, fliptets[1]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
      eprevself(fliptets[1]);
    }
    // The three top edges.
    for (i = 0; i < 3; i++) { // edges b->d, c->d, a->d.
      esym(fliptets[0], newface);
      eprevself(newface); 
      enext(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    // The three bot edges.
    for (i = 0; i < 3; i++) { // edges b<-e, c<-e, a<-e.
      esym(fliptets[1], newface);
      enextself(newface); 
      eprev(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      eprevself(fliptets[1]);
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    face checksh;
    // Bond the top three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [b,a], [c,b], [a,c]
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        esym(fliptets[0], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    // Bond the bottom three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [a,b], [b,c], [c,a]
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        esym(fliptets[1], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      eprevself(fliptets[1]);
    }

    if (scount > 0) {
      face flipfaces[2];
      // Perform a 2-to-2 flip in subfaces.
      flipfaces[0] = flipshs[(spivot + 1) % 3];
      flipfaces[1] = flipshs[(spivot + 2) % 3];
      sesymself(flipfaces[1]);
      flip22(flipfaces, 0, fc->chkencflag);
      // Connect the flipped subfaces to flipped tets.
      // First go to the corresponding flipping edge.
      //   Re-use top- and botcastets[0].
      topcastets[0] = fliptets[0];
      botcastets[0] = fliptets[1];
      for (i = 0; i < ((spivot + 1) % 3); i++) {
        enextself(topcastets[0]);
        eprevself(botcastets[0]);
      }
      // Connect the top subface to the top tets.
      esymself(topcastets[0]);
      sesymself(flipfaces[0]);
      // Check if there already exists a subface.
      tspivot(topcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(topcastets[0], flipfaces[0]);
        fsymself(topcastets[0]);
        sesymself(flipfaces[0]);
        tsbond(topcastets[0], flipfaces[0]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2); 
      }
      // Connect the bot subface to the bottom tets.
      esymself(botcastets[0]);
      sesymself(flipfaces[1]);
      // Check if there already exists a subface.
      tspivot(botcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(botcastets[0], flipfaces[1]);
        fsymself(botcastets[0]);
        sesymself(flipfaces[1]);
        tsbond(botcastets[0], flipfaces[1]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2);  
      }
    } // if (scount > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put two new tets into check list.
    for (i = 0; i < 2; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[1].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) {
        // e were dummypoint. Swap the two new tets.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = newface;
      } else {
        // a or b was dummypoint.
        if (dummyflag == 1) {
          eprevself(fliptets[0]);
          enextself(fliptets[1]);
        } else { // dummyflag == 2
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }
      }
    }
  }
  
  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    // pa = org(fliptets[0]); // 'a' may be a new vertex.
    enextesym(fliptets[0], newface);
    flippush(flipstack, &newface);
    eprevesym(fliptets[1], newface);
    flippush(flipstack, &newface);
    if (fc->enqflag > 1) {
      //pb = dest(fliptets[0]);
      eprevesym(fliptets[0], newface);
      flippush(flipstack, &newface);
      enextesym(fliptets[1], newface);
      flippush(flipstack, &newface);
      //pc = apex(fliptets[0]);
      esym(fliptets[0], newface);
      flippush(flipstack, &newface);
      esym(fliptets[1], newface);
      flippush(flipstack, &newface);
    }
  }

  recenttet = fliptets[0];
}